

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O1

void __thiscall
QFutureInterfaceBase::setContinuation
          (QFutureInterfaceBase *this,QObject *context,function<void_()> func,
          QVariant *continuationFuture,ContinuationType type)

{
  QObject **ppQVar1;
  ulong uVar2;
  PrivateShared *pPVar3;
  Data *pDVar4;
  function<void_(const_QFutureInterfaceBase_&)> func_00;
  QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> QVar5;
  QObject *this_00;
  QThread *pQVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  QSlotObjectBase *pQVar7;
  QVariant *pQVar8;
  undefined8 *puVar9;
  undefined7 in_register_00000009;
  QVariant *p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  ContinuationType type_00;
  undefined4 in_R8D;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long in_FS_OFFSET;
  undefined1 in_stack_ffffffffffffff18 [12];
  undefined8 *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *pcStack_b0;
  undefined1 local_a0 [16];
  QObjectData *local_90;
  undefined1 local_88 [8];
  QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  ExternalRefCountData *local_68;
  QObject *pQStack_60;
  QVariant local_58;
  long local_38;
  
  p = (QVariant *)CONCAT71(in_register_00000009,type);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_80.d = (QObjectData *)operator_new(0x30);
  *(undefined4 *)&(local_80.d)->_vptr_QObjectData = 1;
  (local_80.d)->q_ptr =
       (QObject *)QtPrivate::QCallableObject<std::function<void_()>,_QtPrivate::List<>,_void>::impl;
  (local_80.d)->parent = (QObject *)0x0;
  ((local_80.d)->children).d.d = (Data *)0x0;
  ((local_80.d)->children).d.ptr = (QObject **)0x0;
  ((local_80.d)->children).d.size = *(qsizetype *)&(continuationFuture->d).field_0x18;
  ppQVar1 = *(QObject ***)((long)&(continuationFuture->d).data + 0x10);
  if (ppQVar1 != (QObject **)0x0) {
    pDVar4 = *(Data **)((long)&(continuationFuture->d).data + 8);
    (local_80.d)->parent = (QObject *)(continuationFuture->d).data.shared;
    ((local_80.d)->children).d.d = pDVar4;
    ((local_80.d)->children).d.ptr = ppQVar1;
    *(undefined8 *)((long)&(continuationFuture->d).data + 0x10) = 0;
    *(undefined8 *)&(continuationFuture->d).field_0x18 = 0;
  }
  this_00 = (QObject *)operator_new(0x10);
  QObject::QObject(this_00,(QObject *)0x0);
  this_00->_vptr_QObject = (_func_int **)&PTR_metaObject_006af6e0;
  pQVar6 = QObject::thread(context);
  QObject::moveToThread(this_00,pQVar6);
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  QVar5.d = local_80.d;
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_006af7f0;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[1]._M_use_count = 0;
  this_01[1]._M_weak_count = 0;
  this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = 2;
  }
  local_90 = local_80.d;
  local_80.d = (QObjectData *)0x0;
  local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QObjectContinuationWrapper::run;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pQVar7 = (QSlotObjectBase *)operator_new(0x18);
  (pQVar7->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar7->m_impl =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/thread/qfutureinterface.cpp:962:31),_QtPrivate::List<>,_void>
       ::impl;
  *(QObjectData **)(pQVar7 + 1) = QVar5.d;
  local_90 = (QObjectData *)0x0;
  QObject::connectImpl
            ((QObject *)local_88,this_00,&local_78,context,(void **)0x0,pQVar7,AutoConnection,
             (int *)0x0,&QObjectContinuationWrapper::staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  if (local_90 != (QObjectData *)0x0) {
    QtPrivate::QSlotObjectBase::Deleter::operator()
              ((Deleter *)&local_90,(QSlotObjectBase *)local_90);
  }
  local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QObjectContinuationWrapper::run;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pQVar7 = (QSlotObjectBase *)operator_new(0x28);
  p_Var10 = this_01 + 1;
  (pQVar7->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar7->m_impl =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/thread/qfutureinterface.cpp:952:33),_QtPrivate::List<>,_void>
       ::impl;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pQVar7 + 1) = p_Var10;
  pQVar7[1].m_impl = (ImplFn)this_01;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = this_01->_M_use_count + 1;
  }
  *(QObject **)(pQVar7 + 2) = this_00;
  QObject::connectImpl
            ((QObject *)(local_a0 + 8),this_00,&local_78,this_00,(void **)0x0,pQVar7,AutoConnection,
             (int *)0x0,&QObjectContinuationWrapper::staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)(local_a0 + 8));
  local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QObject::destroyed;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pQVar7 = (QSlotObjectBase *)operator_new(0x28);
  (pQVar7->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar7->m_impl =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/thread/qfutureinterface.cpp:952:33),_QtPrivate::List<>,_void>
       ::impl;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pQVar7 + 1) = p_Var10;
  pQVar7[1].m_impl = (ImplFn)this_01;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = this_01->_M_use_count + 1;
  }
  *(QObject **)(pQVar7 + 2) = this_00;
  QObject::connectImpl
            ((QObject *)local_a0,context,&local_78,this_00,(void **)0x0,pQVar7,AutoConnection,
             (int *)0x0,&QObject::staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  uVar2 = *(ulong *)&(p->d).field_0x18;
  if (uVar2 < 4) {
    type_00 = Unknown;
  }
  else {
    pQVar8 = p;
    if ((uVar2 & 1) != 0) {
      pPVar3 = (p->d).data.shared;
      pQVar8 = (QVariant *)
               ((long)&(pPVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                       _q_value.super___atomic_base<int> + (long)pPVar3->offset);
    }
    type_00 = (ContinuationType)*(undefined8 *)((long)&(pQVar8->d).data + 8);
  }
  pQVar8 = p;
  local_78 = p_Var10;
  p_Stack_70 = this_01;
  local_68 = QtSharedPointer::ExternalRefCountData::getAndRef(this_00);
  pQStack_60 = this_00;
  ::QVariant::QVariant(&local_58,p);
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_c8 = (undefined8 *)0x0;
  uStack_c0 = 0;
  puVar9 = (undefined8 *)operator_new(0x40);
  p_Var10 = p_Stack_70;
  puVar9[1] = 0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *puVar9 = local_78;
  puVar9[1] = p_Var10;
  local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar9[2] = local_68;
  puVar9[3] = pQStack_60;
  local_68 = (ExternalRefCountData *)0x0;
  pQStack_60 = (QObject *)0x0;
  ::QVariant::QVariant((QVariant *)(puVar9 + 4),&local_58);
  pcStack_b0 = std::
               _Function_handler<void_(const_QFutureInterfaceBase_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/thread/qfutureinterface.cpp:988:21)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(const_QFutureInterfaceBase_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/thread/qfutureinterface.cpp:988:21)>
             ::_M_manager;
  func_00.super__Function_base._M_functor._12_4_ = in_R8D;
  func_00.super__Function_base._M_functor._0_12_ = in_stack_ffffffffffffff18;
  func_00.super__Function_base._M_manager = (_Manager_type)this;
  func_00._M_invoker = (_Invoker_type)pQVar8;
  local_c8 = puVar9;
  setContinuation(this,func_00,&local_c8,type_00);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  ::QVariant::~QVariant(&local_58);
  if (local_68 != (ExternalRefCountData *)0x0) {
    LOCK();
    *(int *)local_68 = *(int *)local_68 + -1;
    UNLOCK();
    if ((*(int *)local_68 == 0) && (local_68 != (ExternalRefCountData *)0x0)) {
      operator_delete(local_68);
    }
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  if (local_80.d != (QObjectData *)0x0) {
    QtPrivate::QSlotObjectBase::Deleter::operator()
              ((Deleter *)&local_80,(QSlotObjectBase *)local_80.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setContinuation(const QObject *context, std::function<void()> func,
                                           const QVariant &continuationFuture,
                                           ContinuationType type)
{
    Q_ASSERT(context);

    using FuncType = void();
    using Prototype = typename QtPrivate::Callable<FuncType>::Function;
    auto slotObj = QtPrivate::makeCallableObject<Prototype>(std::move(func));

    auto slot = QtPrivate::SlotObjUniquePtr(slotObj);

    auto *watcher = new QObjectContinuationWrapper;
    watcher->moveToThread(context->thread());

   // We need to protect acccess to the watcher. The context object (and in turn, the watcher)
   // could be destroyed while the continuation that emits the signal is running. We have to
   // prevent that.
   // The mutex has to be recursive, because the continuation itself could delete the context
   // object (and thus the watcher), which will try to lock the mutex from the same thread twice.
    auto watcherMutex = std::make_shared<QRecursiveMutex>();
    const auto destroyWatcher = [watcherMutex, watcher]() mutable {
        QMutexLocker lock(watcherMutex.get());
        delete watcher;
    };

    // ### we're missing a convenient way to `QObject::connect()` to a `QSlotObjectBase`...
    QObject::connect(watcher, &QObjectContinuationWrapper::run,
                     // for the following, cf. QMetaObject::invokeMethodImpl():
                     // we know `slot` is a lambda returning `void`, so we can just
                     // `call()` with `obj` and `args[0]` set to `nullptr`:
                     context, [slot = std::move(slot)] {
                         void *args[] = { nullptr }; // for `void` return value
                         slot->call(nullptr, args);
                     });
    QObject::connect(watcher, &QObjectContinuationWrapper::run, watcher, destroyWatcher);

    // We need to connect to destroyWatcher here, instead of delete or deleteLater().
    // If the continuation is called from a separate thread, emit watcher->run() can't detect that
    // the watcher has been deleted in the separate thread, causing a race condition and potential
    // heap-use-after-free issue inside QObject::doActivate. destroyWatcher forces the deletion of
    // the watcher to occur after emit watcher->run() completes and prevents the race condition.
    QObject::connect(context, &QObject::destroyed, watcher, destroyWatcher);

    // Extract a QFutureInterfaceBasePrivate pointer from the QVariant. We rely
    // on the fact that QVariant contains QFutureInterface<T>.
    QFutureInterfaceBasePrivate *continuationFutureData = nullptr;
    if (continuationFuture.isValid()) {
        Q_ASSERT(QLatin1StringView(continuationFuture.typeName())
                         .startsWith(QLatin1StringView("QFutureInterface")));
        const auto continuationPtr =
                static_cast<const QFutureInterfaceBase *>(continuationFuture.constData());
        continuationFutureData = continuationPtr->d;
    }

    // Capture continuationFuture so that it lives as long as the continuation,
    // and the continuation data remains valid.
    setContinuation([watcherMutex = std::move(watcherMutex),
                     watcher = QPointer(watcher), continuationFuture]
                    (const QFutureInterfaceBase &parentData)
    {
        Q_UNUSED(parentData);
        Q_UNUSED(continuationFuture);
        QMutexLocker lock(watcherMutex.get());
        if (watcher)
            emit watcher->run();
    }, continuationFutureData, type);
}